

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
          (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this,
          ManagedBufferRegistry *registry_,string *name_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *data_)

{
  uint64_t uVar1;
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *buffer;
  function<void_()> *in_stack_ffffffffffffff90;
  ManagedBufferRegistry *this_00;
  WeakReferrable *in_stack_ffffffffffffffb0;
  uint64_t *puVar2;
  
  WeakReferrable::WeakReferrable(in_stack_ffffffffffffffb0);
  *in_RDI = 0x98c090;
  in_RDI[0x19] = 0x98c0b8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  puVar2 = in_RDI + 5;
  uVar1 = internal::getNextUniqueID();
  *puVar2 = uVar1;
  in_RDI[6] = in_RSI;
  in_RDI[7] = in_RCX;
  *(undefined1 *)(in_RDI + 8) = 0;
  buffer = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(in_RDI + 9);
  std::function<void_()>::function(in_stack_ffffffffffffff90);
  *(undefined1 *)(in_RDI + 0xd) = 1;
  this_00 = (ManagedBufferRegistry *)(in_RDI + 0xe);
  std::shared_ptr<polyscope::render::AttributeBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4149fa);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x414a10);
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ::vector((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
            *)0x414a4e);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x414a64);
  if (in_RDI[6] != 0) {
    ManagedBufferRegistry::addManagedBuffer<glm::vec<3,float,(glm::qualifier)0>>(this_00,buffer);
  }
  return;
}

Assistant:

ManagedBuffer<T>::ManagedBuffer(ManagedBufferRegistry* registry_, const std::string& name_, std::vector<T>& data_)
    : name(name_), uniqueID(internal::getNextUniqueID()), registry(registry_), data(data_), dataGetsComputed(false),
      hostBufferIsPopulated(true) {

  if (registry) {
    registry->addManagedBuffer<T>(this);
  }
}